

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

size_t write_int(MIR_context_t ctx,writer_func_t writer,int64_t i)

{
  size_t *psVar1;
  int nb;
  uint64_t u;
  ulong uVar2;
  size_t sVar3;
  size_t n;
  long lVar4;
  
  if (writer != (writer_func_t)0x0) {
    lVar4 = 0;
    for (uVar2 = i; uVar2 != 0; uVar2 = uVar2 >> 8) {
      lVar4 = lVar4 + 1;
    }
    nb = (int)lVar4 + (uint)(lVar4 == 0);
    put_byte(ctx,writer,nb + 8);
    sVar3 = put_uint(ctx,writer,i,nb);
    psVar1 = &ctx->io_ctx->output_int_len;
    *psVar1 = *psVar1 + sVar3 + 1;
    return sVar3 + 1;
  }
  return 0;
}

Assistant:

static size_t write_int (MIR_context_t ctx, writer_func_t writer, int64_t i) {
  size_t nb, len;

  if (writer == NULL) return 0;
  nb = int_length (i);
  assert (nb > 0);
  put_byte (ctx, writer, TAG_I1 + (int) nb - 1);
  len = put_int (ctx, writer, i, (int) nb) + 1;
  output_int_len += len;
  return len;
}